

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif.cpp
# Opt level: O2

AspifOutput * __thiscall Potassco::AspifOutput::add(AspifOutput *this,AtomSpan *atoms)

{
  ostream *poVar1;
  uint *puVar2;
  uint *puVar3;
  
  poVar1 = std::operator<<(this->os_," ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  puVar2 = atoms->first;
  for (puVar3 = puVar2; puVar3 != puVar2 + atoms->size; puVar3 = puVar3 + 1) {
    poVar1 = std::operator<<(this->os_," ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    puVar2 = atoms->first;
  }
  return this;
}

Assistant:

AspifOutput& AspifOutput::add(const AtomSpan& atoms) {
	os_ << " " << size(atoms);
	for (const Atom_t* x = begin(atoms); x != end(atoms); ++x) { os_ << " " << *x; }
	return *this;
}